

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

bool Js::RegexHelper::IsRegexSymbolSplitObservable
               (RecyclableObject *instance,ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptLibrary *this;
  DynamicObject *regexPrototype_00;
  undefined1 local_21;
  DynamicObject *regexPrototype;
  ScriptContext *scriptContext_local;
  RecyclableObject *instance_local;
  
  this = ScriptContext::GetLibrary(scriptContext);
  regexPrototype_00 = JavascriptLibraryBase::GetRegExpPrototype(&this->super_JavascriptLibraryBase);
  bVar1 = JavascriptRegExp::HasOriginalRegExType(instance);
  local_21 = true;
  if (bVar1) {
    bVar1 = JavascriptRegExp::HasObservableConstructor(regexPrototype_00);
    local_21 = true;
    if (!bVar1) {
      bVar1 = JavascriptRegExp::HasObservableFlags(regexPrototype_00);
      local_21 = true;
      if (!bVar1) {
        local_21 = JavascriptRegExp::HasObservableExec(regexPrototype_00);
      }
    }
  }
  return local_21;
}

Assistant:

bool RegexHelper::IsRegexSymbolSplitObservable(RecyclableObject* instance, ScriptContext* scriptContext)
    {
        DynamicObject* regexPrototype = scriptContext->GetLibrary()->GetRegExpPrototype();
        return !JavascriptRegExp::HasOriginalRegExType(instance)
            || JavascriptRegExp::HasObservableConstructor(regexPrototype)
            || JavascriptRegExp::HasObservableFlags(regexPrototype)
            || JavascriptRegExp::HasObservableExec(regexPrototype);
    }